

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

uint32 rw::makeTreeAddr(RGBA color)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar5 = 8;
  uVar6 = 4;
  uVar7 = 2;
  uVar3 = 1;
  uVar1 = 0;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    uVar4 = 0x80 >> ((byte)iVar2 & 0x1f);
    uVar9 = uVar4 & (uint)color;
    if ((uVar4 & (uint)color) != 0) {
      uVar9 = uVar3;
    }
    uVar10 = uVar4 & (uint)color >> 8;
    if (uVar10 != 0) {
      uVar10 = uVar7;
    }
    uVar8 = uVar4 & (uint)color >> 0x10;
    if (uVar8 != 0) {
      uVar8 = uVar6;
    }
    uVar4 = uVar4 & (uint)color >> 0x18;
    if (uVar4 != 0) {
      uVar4 = uVar5;
    }
    uVar1 = uVar1 | uVar4 | uVar8 | uVar10 | uVar9;
    uVar3 = uVar3 << 4;
    uVar7 = uVar7 << 4;
    uVar6 = uVar6 << 4;
    uVar5 = uVar5 << 4;
  }
  return uVar1;
}

Assistant:

static uint32
makeTreeAddr(RGBA color)
{
	int32 i;
	uint32 addr = 0;
	uint32 r = 1;
	uint32 g = 2;
	uint32 b = 4;
	uint32 a = 8;
	for(i = 0; i < 8; i++){
		uint32 mask = 0x80>>i;
		if(color.red & mask) addr |= r;
		if(color.green & mask) addr |= g;
		if(color.blue & mask) addr |= b;
		if(color.alpha & mask) addr |= a;
		r <<= 4;
		g <<= 4;
		b <<= 4;
		a <<= 4;
	}
	return addr;
}